

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  bool bVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  long *plVar6;
  long lVar7;
  ulong *puVar8;
  size_type *psVar9;
  long lVar10;
  TesterType tester;
  GLenum target;
  QueryType QVar11;
  allocator<char> local_ea;
  char local_e9;
  string local_e8;
  string local_c8;
  TestNode *local_a8;
  string local_a0;
  TestNode *local_80;
  long local_78;
  ulong local_70;
  string local_68;
  TestNode *local_48;
  long local_40;
  long local_38;
  
  lVar10 = 0;
  local_80 = (TestNode *)this;
  do {
    pTVar5 = local_80;
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pTVar5->m_testCtx,init::textureTargets[lVar10].name,
               init::textureTargets[lVar10].name);
    tcu::TestNode::addChild(pTVar5,pTVar4);
    local_e9 = init::textureTargets[lVar10].newInGLES31;
    if ((bool)local_e9 == true) {
      pTVar1 = local_80->m_testCtx;
      pRVar2 = (RenderContext *)local_80[1]._vptr_TestNode[1];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"is_texture","");
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"IsTexture","");
      pTVar5 = &deqp::gls::TextureStateQueryTests::createIsTextureTest
                          (pTVar1,pRVar2,&local_c8,&local_e8,init::textureTargets[lVar10].target)->
                super_TestNode;
      tcu::TestNode::addChild(pTVar4,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    local_78 = CONCAT44(local_78._4_4_,init::textureTargets[lVar10].target);
    lVar7 = 0;
    local_48 = pTVar4;
    local_40 = lVar10;
    do {
      local_70 = (ulong)init::states[lVar7].tester;
      local_38 = lVar7;
      bVar3 = deqp::gls::TextureStateQueryTests::isLegalTesterForTarget
                        ((GLenum)local_78,init::states[lVar7].tester);
      if ((bVar3) &&
         ((local_a8 = (TestNode *)(init::states + lVar7), local_e9 != '\0' ||
          (init::states[lVar7].newInGLES31 == true)))) {
        if ((int)local_70 - 0x36U < 3) {
          lVar10 = 0;
          do {
            QVar11 = *(QueryType *)((long)init()::nonPureVerifiers + lVar10);
            pTVar1 = local_80->m_testCtx;
            pRVar2 = (RenderContext *)local_80[1]._vptr_TestNode[1];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar8 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_e8.field_2._M_allocated_capacity = *puVar8;
              local_e8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar8;
              local_e8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_e8._M_string_length = plVar6[1];
            *plVar6 = (long)puVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar9 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_c8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,(char *)local_a8->m_testCtx,&local_ea);
            pTVar5 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar2,&local_c8,&local_68,QVar11,(GLenum)local_78,
                                 (TesterType)local_70)->super_TestNode;
            tcu::TestNode::addChild(local_48,pTVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            lVar10 = lVar10 + 4;
          } while (lVar10 == 4);
        }
        else if ((int)local_70 == 0x35) {
          lVar10 = 0;
          do {
            QVar11 = *(QueryType *)((long)init::vec4Verifiers + lVar10);
            pTVar1 = local_80->m_testCtx;
            pRVar2 = (RenderContext *)local_80[1]._vptr_TestNode[1];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar8 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_e8.field_2._M_allocated_capacity = *puVar8;
              local_e8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar8;
              local_e8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_e8._M_string_length = plVar6[1];
            *plVar6 = (long)puVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar9 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_c8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,(char *)local_a8->m_testCtx,&local_ea);
            pTVar5 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar2,&local_c8,&local_68,QVar11,(GLenum)local_78,
                                 (TesterType)local_70)->super_TestNode;
            tcu::TestNode::addChild(local_48,pTVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            lVar10 = lVar10 + 4;
          } while (lVar10 != 0x10);
        }
        else {
          lVar10 = 0;
          do {
            QVar11 = *(QueryType *)((long)init::scalarVerifiers + lVar10);
            pTVar1 = local_80->m_testCtx;
            pRVar2 = (RenderContext *)local_80[1]._vptr_TestNode[1];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar8 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_e8.field_2._M_allocated_capacity = *puVar8;
              local_e8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar8;
              local_e8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_e8._M_string_length = plVar6[1];
            *plVar6 = (long)puVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar9 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_c8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,(char *)local_a8->m_testCtx,&local_ea);
            pTVar5 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar2,&local_c8,&local_68,QVar11,(GLenum)local_78,
                                 (TesterType)local_70)->super_TestNode;
            tcu::TestNode::addChild(local_48,pTVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            lVar10 = lVar10 + 4;
          } while (lVar10 != 0x10);
        }
      }
      lVar7 = local_38 + 1;
    } while (lVar7 != 0x17);
    lVar10 = local_40 + 1;
  } while (lVar10 != 8);
  lVar10 = 0;
  do {
    pTVar5 = local_80;
    pTVar4 = (TestNode *)operator_new(0x70);
    local_78 = lVar10;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pTVar5->m_testCtx,init::pureSetters[lVar10].name,
               init::pureSetters[lVar10].desc);
    local_a8 = pTVar4;
    tcu::TestNode::addChild(pTVar5,pTVar4);
    QVar11 = init::pureSetters[lVar10].verifier;
    lVar10 = 0x14;
    local_70 = CONCAT44(local_70._4_4_,QVar11);
    do {
      if (QVar11 == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER) {
        tester = *(TesterType *)((long)&init::pureStates[0].name + lVar10);
      }
      else {
        tester = TESTER_LAST;
        if (QVar11 == QUERY_TEXTURE_PARAM_PURE_INTEGER) {
          tester = *(TesterType *)(&init::pureSetters[1].field_0x14 + lVar10);
        }
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      target = 0xde1;
      if (*(int *)(&init::pureSetters[1].field_0x14 + lVar10) == 0x13) {
        target = 0x806f;
      }
      pTVar1 = local_80->m_testCtx;
      pRVar2 = (RenderContext *)local_80[1]._vptr_TestNode[1];
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity =
           local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_c8.field_2._M_allocated_capacity = *psVar9;
        local_c8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar9;
        local_c8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_c8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,*(char **)((long)&init::pureSetters[1].desc + lVar10 + 4),
                 (allocator<char> *)&local_68);
      QVar11 = (QueryType)local_70;
      pTVar5 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                          (pTVar1,pRVar2,&local_c8,&local_a0,(QueryType)local_70,target,tester)->
                super_TestNode;
      tcu::TestNode::addChild(local_a8,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x1ac);
    lVar10 = local_78 + 1;
  } while (local_78 == 0);
  return (int)lVar10;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	static const QueryType scalarVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
		QUERY_TEXTURE_PARAM_PURE_INTEGER,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
	};
	static const QueryType vec4Verifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_FLOAT_VEC4,
		QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		glw::GLenum	target;
		bool		newInGLES31;
	} textureTargets[] =
	{
		{ "texture_2d",						GL_TEXTURE_2D,						false,	},
		{ "texture_3d",						GL_TEXTURE_3D,						false,	},
		{ "texture_2d_array",				GL_TEXTURE_2D_ARRAY,				false,	},
		{ "texture_cube_map",				GL_TEXTURE_CUBE_MAP,				false,	},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE,			true,	},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	true,	}, // GL_OES_texture_storage_multisample_2d_array
		{ "texture_buffer",					GL_TEXTURE_BUFFER,					true,	}, // GL_EXT_texture_buffer
		{ "texture_cube_array",				GL_TEXTURE_CUBE_MAP_ARRAY,			true,	}, // GL_EXT_texture_cube_map_array
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R,				false	},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G,				false	},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B,				false	},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A,				false	},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL,				false	},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL,				false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_immutable_levels",		"TEXTURE_IMMUTABLE_LEVELS",			TESTER_TEXTURE_IMMUTABLE_LEVELS,		false	},
		{ "texture_immutable_format",		"TEXTURE_IMMUTABLE_FORMAT",			TESTER_TEXTURE_IMMUTABLE_FORMAT,		false	},
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE,		true	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_TEXTURE_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_R_SET_PURE_UINT				},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_G_SET_PURE_UINT				},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_B_SET_PURE_UINT				},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_A_SET_PURE_UINT				},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_BASE_LEVEL_SET_PURE_UINT				},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_MAX_LEVEL_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		// \note texture_immutable_levels is not settable
		// \note texture_immutable_format is not settable
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_INT,	TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_UINT		},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, textureTargets[targetNdx].name, textureTargets[targetNdx].name);
		addChild(targetGroup);

		if (textureTargets[targetNdx].newInGLES31)
		{
			targetGroup->addChild(createIsTextureTest(m_testCtx,
													  m_context.getRenderContext(),
													  "is_texture",
													  "IsTexture",
													  textureTargets[targetNdx].target));
		}

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			if (!isLegalTesterForTarget(textureTargets[targetNdx].target, states[stateNdx].tester))
				continue;

			// for old targets, check only new states
			if (!textureTargets[targetNdx].newInGLES31 && !states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createTexParamTest(m_testCtx,
																	   m_context.getRenderContext(),
																	   std::string() + states[stateNdx].name + verifierSuffix,
																	   states[stateNdx].desc,
																	   verifier,
																	   textureTargets[targetNdx].target,
																	   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vec4Verifiers, createTexParamTest(m_testCtx,
																	m_context.getRenderContext(),
																	std::string() + states[stateNdx].name + verifierSuffix,
																	states[stateNdx].desc,
																	verifier,
																	textureTargets[targetNdx].target,
																	states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createTexParamTest(m_testCtx,
																	  m_context.getRenderContext(),
																	  std::string() + states[stateNdx].name + verifierSuffix,
																	  states[stateNdx].desc,
																	  verifier,
																	  textureTargets[targetNdx].target,
																	  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);
			// need 3d texture to test R wrap
			const glw::GLenum	target	= (pureStates[stateNdx].intTester == TESTER_TEXTURE_WRAP_R_SET_PURE_INT) ? (GL_TEXTURE_3D) : (GL_TEXTURE_2D);

			targetGroup->addChild(createTexParamTest(m_testCtx,
													 m_context.getRenderContext(),
													 std::string() + pureStates[stateNdx].name,
													 pureStates[stateNdx].desc,
													 pureSetters[setterNdx].verifier,
													 target,
													 tester));
		}
	}
}